

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenStoreSetValue(BinaryenExpressionRef expr,BinaryenExpressionRef valueExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef valueExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::Store>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Store>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xaa5,"void BinaryenStoreSetValue(BinaryenExpressionRef, BinaryenExpressionRef)")
    ;
  }
  if (valueExpr != (BinaryenExpressionRef)0x0) {
    expr[3].type.id = (uintptr_t)valueExpr;
    return;
  }
  __assert_fail("valueExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xaa6,"void BinaryenStoreSetValue(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenStoreSetValue(BinaryenExpressionRef expr,
                           BinaryenExpressionRef valueExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Store>());
  assert(valueExpr);
  static_cast<Store*>(expression)->value = (Expression*)valueExpr;
}